

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::ReadRandom(Benchmark *this,ThreadState *thread)

{
  DB *pDVar1;
  bool bVar2;
  uint32_t uVar3;
  Stats *this_00;
  Slice local_158;
  char local_148 [8];
  char msg [100];
  Slice local_d8;
  Status local_c8;
  uint local_bc;
  char local_b8 [4];
  int k;
  char key [100];
  uint local_4c;
  int i;
  int found;
  string value;
  undefined1 local_28 [8];
  ReadOptions options;
  ThreadState *thread_local;
  Benchmark *this_local;
  
  options.snapshot = (Snapshot *)thread;
  ReadOptions::ReadOptions((ReadOptions *)local_28);
  std::__cxx11::string::string((string *)&i);
  local_4c = 0;
  key[0x60] = '\0';
  key[0x61] = '\0';
  key[0x62] = '\0';
  key[99] = '\0';
  for (; (int)key._96_4_ < this->reads_; key._96_4_ = key._96_4_ + 1) {
    uVar3 = Random::Next((Random *)((long)&(options.snapshot)->_vptr_Snapshot + 4));
    local_bc = uVar3 % (uint)FLAGS_num;
    snprintf(local_b8,100,"%016d",(ulong)local_bc);
    pDVar1 = this->db_;
    Slice::Slice(&local_d8,local_b8);
    (*pDVar1->_vptr_DB[5])(&local_c8,pDVar1,local_28,&local_d8,&i);
    bVar2 = Status::ok(&local_c8);
    Status::~Status(&local_c8);
    if (bVar2) {
      local_4c = local_4c + 1;
    }
    anon_unknown_0::Stats::FinishedSingleOp((Stats *)(options.snapshot + 1));
  }
  snprintf(local_148,100,"(%d of %d found)",(ulong)local_4c,(ulong)(uint)this->num_);
  this_00 = (Stats *)(options.snapshot + 1);
  Slice::Slice(&local_158,local_148);
  anon_unknown_0::Stats::AddMessage(this_00,local_158);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void ReadRandom(ThreadState* thread) {
    ReadOptions options;
    std::string value;
    int found = 0;
    for (int i = 0; i < reads_; i++) {
      char key[100];
      const int k = thread->rand.Next() % FLAGS_num;
      snprintf(key, sizeof(key), "%016d", k);
      if (db_->Get(options, key, &value).ok()) {
        found++;
      }
      thread->stats.FinishedSingleOp();
    }
    char msg[100];
    snprintf(msg, sizeof(msg), "(%d of %d found)", found, num_);
    thread->stats.AddMessage(msg);
  }